

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O1

bool wal_txn_exists(filemgr *file)

{
  list_elem *plVar1;
  bool bVar2;
  
  pthread_spin_lock(&file->wal->lock);
  plVar1 = (file->wal->txn_list).head;
  bVar2 = plVar1 != (list_elem *)0x0;
  if (bVar2) {
    do {
      if ((fdb_txn *)plVar1[1].prev != &file->global_txn) break;
      plVar1 = plVar1->next;
      bVar2 = plVar1 != (list_elem *)0x0;
    } while (bVar2);
  }
  pthread_spin_unlock(&file->wal->lock);
  return bVar2;
}

Assistant:

bool wal_txn_exists(struct filemgr *file)
{
    struct list_elem *le;
    struct wal_txn_wrapper *txn_wrapper;
    fdb_txn *txn;

    spin_lock(&file->wal->lock);

    le = list_begin(&file->wal->txn_list);
    while(le) {
        txn_wrapper = _get_entry(le, struct wal_txn_wrapper, le);
        txn = txn_wrapper->txn;
        if (txn != &file->global_txn) {
            spin_unlock(&file->wal->lock);
            return true;
        }
        le = list_next(le);
    }
    spin_unlock(&file->wal->lock);

    return false;
}